

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O2

bool __thiscall
lan::db::set_bit<double>
          (db *this,db_bit *context,db_bit *var,string *name,db_bit_type type,double value)

{
  double *pdVar1;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  set_bit(this,context,var,&local_48,type);
  std::__cxx11::string::~string((string *)&local_48);
  pdVar1 = (double *)operator_new(8);
  *pdVar1 = value;
  var->data = pdVar1;
  return true;
}

Assistant:

bool set_bit(db_bit * context, db_bit * var,std::string const name, db_bit_type const type, any const value){
            set_bit(context, var, name, type);
            var->data = new any (value);
            return (var->data);
        }